

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O1

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::set_paging<2>
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this)

{
  bool bVar1;
  bool bVar2;
  uint8_t *puVar3;
  long lVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  lVar4 = (ulong)(this->auxiliary_switches_).switches_.alternative_zero_page * 0x10000;
  this->write_pages_[0] = this->ram_ + lVar4;
  this->write_pages_[1] = this->ram_ + lVar4 + 0x100;
  this->read_pages_[0] = this->ram_ + lVar4;
  this->read_pages_[1] = this->ram_ + lVar4 + 0x100;
  bVar1 = (this->language_card_).state_.read;
  bVar2 = (this->language_card_).state_.write;
  puVar5 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = puVar5;
  if ((bVar1 & 1U) != 0) {
    puVar3 = this->ram_ + (ulong)(((this->language_card_).state_.bank2 & 1) << 0xc) + lVar4 + 0xc000
    ;
  }
  puVar7 = (uint8_t *)0x0;
  puVar6 = this->ram_ + (ulong)(((this->language_card_).state_.bank2 & 1) << 0xc) + lVar4 + 0xc000;
  if ((bVar2 & 1U) != 0) {
    puVar6 = puVar7;
  }
  do {
    this->read_pages_[(long)(puVar7 + 0xd0)] = puVar3;
    if (puVar3 != (uint8_t *)0x0) {
      puVar3 = puVar3 + 0x100;
    }
    this->write_pages_[(long)(puVar7 + 0xd0)] = puVar6;
    if (puVar6 != (uint8_t *)0x0) {
      puVar6 = puVar6 + 0x100;
    }
    puVar7 = puVar7 + 1;
  } while (puVar7 != (uint8_t *)0x10);
  puVar5 = puVar5 + 0x1000;
  if ((bVar1 & 1U) != 0) {
    puVar5 = this->ram_ + lVar4 + 0xe000;
  }
  puVar6 = (uint8_t *)0x0;
  puVar3 = this->ram_ + lVar4 + 0xe000;
  if ((bVar2 & 1U) != 0) {
    puVar3 = puVar6;
  }
  do {
    this->read_pages_[(long)(puVar6 + 0xe0)] = puVar5;
    if (puVar5 != (uint8_t *)0x0) {
      puVar5 = puVar5 + 0x100;
    }
    this->write_pages_[(long)(puVar6 + 0xe0)] = puVar3;
    if (puVar3 != (uint8_t *)0x0) {
      puVar3 = puVar3 + 0x100;
    }
    puVar6 = puVar6 + 1;
  } while (puVar6 != (uint8_t *)0x20);
  return;
}

Assistant:

bool is_every_cycle_card(const Apple::II::Card *card) {
			return !card->get_select_constraints();
		}